

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int clearDatabasePage(BtShared *pBt,Pgno pgno,int freePageFlag,int *pnChange)

{
  Pgno PVar1;
  int iVar2;
  uint uVar3;
  MemPage *pPage_00;
  int *in_RCX;
  int in_EDX;
  uint in_ESI;
  BtShared *in_RDI;
  CellInfo info;
  int hdr;
  int i;
  uchar *pCell;
  int rc;
  MemPage *pPage;
  PgHdr *in_stack_ffffffffffffff88;
  BtShared *in_stack_ffffffffffffff90;
  BtShared *in_stack_ffffffffffffff98;
  int flags;
  undefined4 in_stack_ffffffffffffffa0;
  MemPage **in_stack_ffffffffffffffa8;
  Pgno in_stack_ffffffffffffffb4;
  BtShared *in_stack_ffffffffffffffb8;
  int local_2c;
  int *in_stack_ffffffffffffffd8;
  uint uVar4;
  
  uVar4 = in_ESI;
  PVar1 = btreePagecount(in_RDI);
  if (PVar1 < in_ESI) {
    iVar2 = sqlite3CorruptError(0);
    return iVar2;
  }
  iVar2 = getAndInitPage(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                         in_stack_ffffffffffffffa8,
                         (BtCursor *)CONCAT44(in_ESI,in_stack_ffffffffffffffa0),
                         (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  if (iVar2 != 0) {
    return iVar2;
  }
  if (*(char *)((long)in_stack_ffffffffffffffd8 + 1) == '\0') {
    *(undefined1 *)((long)in_stack_ffffffffffffffd8 + 1) = 1;
    uVar3 = (uint)*(byte *)((long)in_stack_ffffffffffffffd8 + 9);
    local_2c = 0;
    for (iVar2 = 0; flags = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
        iVar2 < (int)(uint)*(ushort *)((long)in_stack_ffffffffffffffd8 + 0x16); iVar2 = iVar2 + 1) {
      pPage_00 = (MemPage *)
                 (*(long *)(in_stack_ffffffffffffffd8 + 0x14) +
                 (long)(int)(uint)(*(ushort *)(in_stack_ffffffffffffffd8 + 6) &
                                  CONCAT11(*(undefined1 *)
                                            (*(long *)(in_stack_ffffffffffffffd8 + 0x18) +
                                            (long)(iVar2 << 1)),
                                           *(undefined1 *)
                                            (*(long *)(in_stack_ffffffffffffffd8 + 0x18) + 1 +
                                            (long)(iVar2 << 1)))));
      if ((char)in_stack_ffffffffffffffd8[2] == '\0') {
        in_stack_ffffffffffffff98 = in_RDI;
        sqlite3Get4byte((u8 *)pPage_00);
        local_2c = clearDatabasePage((BtShared *)CONCAT44(uVar4,in_EDX),
                                     (Pgno)((ulong)in_RCX >> 0x20),(int)in_RCX,
                                     in_stack_ffffffffffffffd8);
        if (local_2c != 0) goto LAB_0017a038;
      }
      local_2c = clearCell(pPage_00,(uchar *)CONCAT44(iVar2,uVar3),
                           (CellInfo *)in_stack_ffffffffffffffb8);
      if (local_2c != 0) goto LAB_0017a038;
    }
    if ((char)in_stack_ffffffffffffffd8[2] == '\0') {
      sqlite3Get4byte((u8 *)(*(long *)(in_stack_ffffffffffffffd8 + 0x14) + (long)(int)(uVar3 + 8)));
      local_2c = clearDatabasePage((BtShared *)CONCAT44(uVar4,in_EDX),(Pgno)((ulong)in_RCX >> 0x20),
                                   (int)in_RCX,in_stack_ffffffffffffffd8);
      if (local_2c != 0) goto LAB_0017a038;
    }
    else {
      in_RDI = in_stack_ffffffffffffff90;
      if (in_RCX != (int *)0x0) {
        *in_RCX = (uint)*(ushort *)((long)in_stack_ffffffffffffffd8 + 0x16) + *in_RCX;
      }
    }
    if (in_EDX == 0) {
      local_2c = sqlite3PagerWrite(in_stack_ffffffffffffff88);
      if (local_2c == 0) {
        zeroPage((MemPage *)CONCAT44(in_ESI,in_stack_ffffffffffffffa0),flags);
      }
    }
    else {
      freePage((MemPage *)in_RDI,(int *)in_stack_ffffffffffffff88);
    }
  }
  else {
    local_2c = sqlite3CorruptError(0);
  }
LAB_0017a038:
  *(undefined1 *)((long)in_stack_ffffffffffffffd8 + 1) = 0;
  releasePage((MemPage *)0x17a04b);
  return local_2c;
}

Assistant:

static int clearDatabasePage(
  BtShared *pBt,           /* The BTree that contains the table */
  Pgno pgno,               /* Page number to clear */
  int freePageFlag,        /* Deallocate page if true */
  int *pnChange            /* Add number of Cells freed to this counter */
){
  MemPage *pPage;
  int rc;
  unsigned char *pCell;
  int i;
  int hdr;
  CellInfo info;

  assert( sqlite3_mutex_held(pBt->mutex) );
  if( pgno>btreePagecount(pBt) ){
    return SQLITE_CORRUPT_BKPT;
  }
  rc = getAndInitPage(pBt, pgno, &pPage, 0, 0);
  if( rc ) return rc;
  if( pPage->bBusy ){
    rc = SQLITE_CORRUPT_BKPT;
    goto cleardatabasepage_out;
  }
  pPage->bBusy = 1;
  hdr = pPage->hdrOffset;
  for(i=0; i<pPage->nCell; i++){
    pCell = findCell(pPage, i);
    if( !pPage->leaf ){
      rc = clearDatabasePage(pBt, get4byte(pCell), 1, pnChange);
      if( rc ) goto cleardatabasepage_out;
    }
    rc = clearCell(pPage, pCell, &info);
    if( rc ) goto cleardatabasepage_out;
  }
  if( !pPage->leaf ){
    rc = clearDatabasePage(pBt, get4byte(&pPage->aData[hdr+8]), 1, pnChange);
    if( rc ) goto cleardatabasepage_out;
  }else if( pnChange ){
    assert( pPage->intKey || CORRUPT_DB );
    testcase( !pPage->intKey );
    *pnChange += pPage->nCell;
  }
  if( freePageFlag ){
    freePage(pPage, &rc);
  }else if( (rc = sqlite3PagerWrite(pPage->pDbPage))==0 ){
    zeroPage(pPage, pPage->aData[hdr] | PTF_LEAF);
  }

cleardatabasepage_out:
  pPage->bBusy = 0;
  releasePage(pPage);
  return rc;
}